

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void term_paint(Terminal *term,wchar_t left,wchar_t top,wchar_t right,wchar_t bottom,
               _Bool immediately)

{
  termchar *ptVar1;
  bool bVar2;
  wchar_t local_2c;
  wchar_t local_28;
  wchar_t j;
  wchar_t i;
  wchar_t wStack_1c;
  _Bool immediately_local;
  wchar_t bottom_local;
  wchar_t right_local;
  wchar_t top_local;
  wchar_t left_local;
  Terminal *term_local;
  
  right_local = left;
  if (left < L'\0') {
    right_local = L'\0';
  }
  bottom_local = top;
  if (top < L'\0') {
    bottom_local = L'\0';
  }
  wStack_1c = right;
  if (term->cols <= right) {
    wStack_1c = term->cols + L'\xffffffff';
  }
  i = bottom;
  if (term->rows <= bottom) {
    i = term->rows + L'\xffffffff';
  }
  local_28 = bottom_local;
  while( true ) {
    bVar2 = false;
    if (local_28 <= i) {
      bVar2 = local_28 < term->rows;
    }
    if (!bVar2) break;
    if ((term->disptext[local_28]->lattr & 3) == 0) {
      local_2c = right_local;
      while( true ) {
        bVar2 = false;
        if (local_2c <= wStack_1c) {
          bVar2 = local_2c < term->cols;
        }
        if (!bVar2) break;
        ptVar1 = term->disptext[local_28]->chars;
        ptVar1[local_2c].attr = ptVar1[local_2c].attr | 0x3ffff;
        local_2c = local_2c + L'\x01';
      }
    }
    else {
      local_2c = right_local / 2;
      while( true ) {
        bVar2 = false;
        if (local_2c <= wStack_1c / 2 + L'\x01') {
          bVar2 = local_2c < term->cols;
        }
        if (!bVar2) break;
        ptVar1 = term->disptext[local_28]->chars;
        ptVar1[local_2c].attr = ptVar1[local_2c].attr | 0x3ffff;
        local_2c = local_2c + L'\x01';
      }
    }
    local_28 = local_28 + L'\x01';
  }
  if (immediately) {
    do_paint(term);
  }
  else {
    term_schedule_update(term);
  }
  return;
}

Assistant:

void term_paint(Terminal *term,
                int left, int top, int right, int bottom, bool immediately)
{
    int i, j;
    if (left < 0) left = 0;
    if (top < 0) top = 0;
    if (right >= term->cols) right = term->cols-1;
    if (bottom >= term->rows) bottom = term->rows-1;

    for (i = top; i <= bottom && i < term->rows; i++) {
        if ((term->disptext[i]->lattr & LATTR_MODE) == LATTR_NORM)
            for (j = left; j <= right && j < term->cols; j++)
                term->disptext[i]->chars[j].attr |= ATTR_INVALID;
        else
            for (j = left / 2; j <= right / 2 + 1 && j < term->cols; j++)
                term->disptext[i]->chars[j].attr |= ATTR_INVALID;
    }

    if (immediately) {
        do_paint(term);
    } else {
        term_schedule_update(term);
    }
}